

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_threadnames_tests.cpp
# Opt level: O1

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
util_threadnames_tests::RenameEnMasse_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,util_threadnames_tests *this,int num_threads)

{
  _Rb_tree_header *p_Var1;
  pointer ptVar2;
  pointer ptVar3;
  ulong uVar4;
  allocator_type *paVar5;
  allocator_type *paVar6;
  undefined8 uVar7;
  thread __args_1;
  thread *thread;
  int iVar8;
  ulong __n;
  ulong uVar9;
  allocator_type *paVar10;
  long in_FS_OFFSET;
  anon_class_16_2_f7c77348_for__M_head_impl RenameThisThread;
  mutex lock;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  undefined1 local_9c [20];
  int local_88 [12];
  vector<std::thread,_std::allocator<std::thread>_> local_58;
  long local_38;
  
  iVar8 = (int)this;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  __args_1._M_id._M_thread = (id)local_88;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_9c._4_8_ = __args_1._M_id._M_thread;
  local_9c._12_8_ = __return_storage_ptr__;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&local_58,(long)iVar8);
  local_9c._0_4_ = 0;
  paVar10 = (allocator_type *)
            local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start;
  paVar5 = (allocator_type *)
           local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (0 < iVar8) {
    do {
      ptVar3 = local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar2 = local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        if ((long)local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar7 = std::__throw_length_error("vector::_M_realloc_insert");
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&__return_storage_ptr__->_M_t);
            std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar7);
            }
          }
          goto LAB_00760b8c;
        }
        uVar9 = (long)local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                      .super__Vector_impl_data._M_start >> 3;
        uVar4 = uVar9 + (uVar9 == 0);
        __n = uVar4 + uVar9;
        __args_1._M_id._M_thread = (id)0xfffffffffffffff;
        if (0xffffffffffffffe < __n) {
          __n = 0xfffffffffffffff;
        }
        if (CARRY8(uVar4,uVar9)) {
          __n = 0xfffffffffffffff;
        }
        if (__n == 0) {
          paVar5 = (allocator_type *)0x0;
        }
        else {
          paVar5 = (allocator_type *)
                   __gnu_cxx::new_allocator<std::thread>::allocate
                             ((new_allocator<std::thread> *)&local_58,__n,(void *)0x0);
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,util_threadnames_tests::RenameEnMasse[abi:cxx11](int)::__0&,int&>
                  (paVar5 + uVar9 * 8,(thread *)(local_9c + 4),
                   (anon_class_16_2_f7c77348_for__M_head_impl *)local_9c,
                   (int *)__args_1._M_id._M_thread);
        paVar10 = paVar5;
        for (paVar6 = (allocator_type *)ptVar2; paVar6 != (allocator_type *)ptVar3;
            paVar6 = paVar6 + 8) {
          *(id *)paVar10 = (id)0x0;
          __args_1._M_id._M_thread = *(id *)paVar6;
          *(id *)paVar10 = __args_1._M_id._M_thread;
          *(id *)paVar6 = (id)0x0;
          paVar10 = paVar10 + 8;
        }
        if ((allocator_type *)ptVar2 != (allocator_type *)0x0) {
          operator_delete(ptVar2,(long)local_58.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ptVar2);
        }
        local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(paVar5 + __n * 8);
        local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)paVar5;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,util_threadnames_tests::RenameEnMasse[abi:cxx11](int)::__0&,int&>
                  ((allocator_type *)
                   local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,(thread *)(local_9c + 4),
                   (anon_class_16_2_f7c77348_for__M_head_impl *)local_9c,
                   (int *)__args_1._M_id._M_thread);
        paVar10 = (allocator_type *)
                  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(paVar10 + 8);
      local_9c._0_4_ = local_9c._0_4_ + 1;
      paVar10 = (allocator_type *)
                local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      paVar5 = (allocator_type *)
               local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while ((int)local_9c._0_4_ < iVar8);
  }
  for (; paVar10 != paVar5; paVar10 = paVar10 + 8) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00760b8c:
  __stack_chk_fail();
}

Assistant:

std::set<std::string> RenameEnMasse(int num_threads)
{
    std::vector<std::thread> threads;
    std::set<std::string> names;
    std::mutex lock;

    auto RenameThisThread = [&](int i) {
        util::ThreadRename(TEST_THREAD_NAME_BASE + ToString(i));
        std::lock_guard<std::mutex> guard(lock);
        names.insert(util::ThreadGetInternalName());
    };

    threads.reserve(num_threads);
    for (int i = 0; i < num_threads; ++i) {
        threads.emplace_back(RenameThisThread, i);
    }

    for (std::thread& thread : threads) thread.join();

    return names;
}